

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.h
# Opt level: O0

void __thiscall spvtools::opt::RelaxFloatOpsPass::RelaxFloatOpsPass(RelaxFloatOpsPass *this)

{
  RelaxFloatOpsPass *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__RelaxFloatOpsPass_010e5ec8;
  std::
  unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->target_ops_core_f_rslt_);
  std::
  unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->target_ops_core_f_opnd_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->target_ops_450_);
  std::
  unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->sample_ops_);
  return;
}

Assistant:

RelaxFloatOpsPass() : Pass() {}